

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  char cVar3;
  ImGuiTable *pIVar4;
  char *pcVar5;
  ImGuiTableColumn *pIVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  ImGuiTableColumnIdx IVar10;
  ImGuiTableColumnIdx IVar11;
  
  IVar10 = (ImGuiTableColumnIdx)rows;
  pIVar4 = GImGui->CurrentTable;
  uVar8 = 0;
  if (((uint)pIVar4->Flags >> 0x18 & 1) != 0) {
    uVar8 = pIVar4->ColumnsCount;
    if (columns < pIVar4->ColumnsCount) {
      uVar8 = columns;
    }
  }
  cVar7 = (char)uVar8;
  pIVar4->FreezeColumnsRequest = cVar7;
  pIVar1 = &pIVar4->InnerWindow->Scroll;
  IVar11 = '\0';
  if (pIVar1->x != 0.0) {
    IVar11 = cVar7;
  }
  if (NAN(pIVar1->x)) {
    IVar11 = cVar7;
  }
  pIVar4->FreezeColumnsCount = IVar11;
  if (((uint)pIVar4->Flags >> 0x19 & 1) == 0) {
    IVar10 = '\0';
  }
  pIVar4->FreezeRowsRequest = IVar10;
  pfVar2 = &(pIVar4->InnerWindow->Scroll).y;
  IVar11 = '\0';
  if (*pfVar2 != 0.0) {
    IVar11 = IVar10;
  }
  if (NAN(*pfVar2)) {
    IVar11 = IVar10;
  }
  pIVar4->FreezeRowsCount = IVar11;
  pIVar4->IsUnfrozenRows = IVar11 == '\0';
  if ('\0' < cVar7) {
    uVar9 = 0;
    do {
      pcVar5 = (pIVar4->DisplayOrderToIndex).Data;
      cVar7 = pcVar5[uVar9];
      if ((char)uVar8 <= cVar7 && uVar9 != (uint)(int)cVar7) {
        cVar3 = pcVar5[cVar7];
        pIVar6 = (pIVar4->Columns).Data;
        IVar10 = pIVar6[cVar3].DisplayOrder;
        pIVar6[cVar3].DisplayOrder = pIVar6[cVar7].DisplayOrder;
        pIVar6[cVar7].DisplayOrder = IVar10;
        pcVar5 = (pIVar4->DisplayOrderToIndex).Data;
        cVar3 = pcVar5[cVar7];
        pcVar5[cVar7] = pcVar5[uVar9];
        pcVar5[uVar9] = cVar3;
        uVar8 = (uint)(byte)pIVar4->FreezeColumnsRequest;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)(char)uVar8);
  }
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}